

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_type_resp(Curl_easy *data,int ftpcode,ftpstate instate)

{
  connectdata *pcVar1;
  CURLcode CVar2;
  char *in_RAX;
  connectdata *conn;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  ftpstate instate_00;
  char *pcVar6;
  char *pcVar7;
  char *local_38;
  
  if (99 < ftpcode - 200U) {
    Curl_failf(data,"Couldn\'t set desired mode");
    return CURLE_FTP_COULDNT_SET_TYPE;
  }
  pcVar1 = data->conn;
  local_38 = in_RAX;
  if (ftpcode != 200) {
    Curl_infof(data,"Got a %03d response code instead of the assumed 200");
  }
  switch(instate) {
  case FTP_TYPE:
    CVar2 = ftp_state_size(data,pcVar1);
    return CVar2;
  case FTP_LIST_TYPE:
    pcVar1 = data->conn;
    if (((data->set).ftp_filemethod == '\x02') &&
       (pcVar7 = ((data->req).p.file)->path, pcVar7 != (char *)0x0)) {
      local_38 = (char *)0x0;
      CVar2 = Curl_urldecode(pcVar7,0,&local_38,(size_t *)0x0,REJECT_CTRL);
      pcVar7 = local_38;
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      pcVar3 = strrchr(local_38,0x2f);
      if (pcVar3 == (char *)0x0) {
        (*Curl_cfree)(pcVar7);
        goto LAB_00529eb6;
      }
      lVar4 = 1;
      if ((long)pcVar3 - (long)pcVar7 != 0) {
        lVar4 = (long)pcVar3 - (long)pcVar7;
      }
      pcVar7[lVar4] = '\0';
    }
    else {
LAB_00529eb6:
      pcVar7 = (char *)0x0;
    }
    pcVar3 = (data->set).str[6];
    if ((pcVar3 == (char *)0x0) && (pcVar3 = "NLST", ((data->state).field_0x6d2 & 1) == 0)) {
      pcVar3 = "LIST";
    }
    pcVar6 = " ";
    pcVar5 = pcVar7;
    if (pcVar7 == (char *)0x0) {
      pcVar6 = "";
      pcVar5 = "";
    }
    pcVar3 = curl_maprintf("%s%s%s",pcVar3,pcVar6,pcVar5);
    (*Curl_cfree)(pcVar7);
    if (pcVar3 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar2 = Curl_pp_sendf(data,&(pcVar1->proto).ftpc.pp,"%s",pcVar3);
    (*Curl_cfree)(pcVar3);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    (data->conn->proto).ftpc.state = FTP_LIST;
switchD_00529dd3_default:
    return CURLE_OK;
  case FTP_RETR_TYPE:
    instate_00 = FTP_RETR_PREQUOTE;
    break;
  case FTP_STOR_TYPE:
    instate_00 = FTP_STOR_PREQUOTE;
    break;
  default:
    goto switchD_00529dd3_default;
  }
  CVar2 = ftp_state_quote(data,true,instate_00);
  return CVar2;
}

Assistant:

static CURLcode ftp_state_type_resp(struct Curl_easy *data,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;

  if(ftpcode/100 != 2) {
    /* "sasserftpd" and "(u)r(x)bot ftpd" both responds with 226 after a
       successful 'TYPE I'. While that is not as RFC959 says, it is still a
       positive response code and we allow that. */
    failf(data, "Couldn't set desired mode");
    return CURLE_FTP_COULDNT_SET_TYPE;
  }
  if(ftpcode != 200)
    infof(data, "Got a %03d response code instead of the assumed 200",
          ftpcode);

  if(instate == FTP_TYPE)
    result = ftp_state_size(data, conn);
  else if(instate == FTP_LIST_TYPE)
    result = ftp_state_list(data);
  else if(instate == FTP_RETR_TYPE)
    result = ftp_state_retr_prequote(data);
  else if(instate == FTP_STOR_TYPE)
    result = ftp_state_stor_prequote(data);

  return result;
}